

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageErrorsTest::iterate(StorageErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar6;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    PrepareObjects(this);
    (**(code **)(lVar6 + 0xfa8))(this->m_rbo_invalid,0x8058,1,1);
    bVar1 = ExpectError(this,0x502,"NamedRenderbufferStorage",
                        "renderbuffer is not the name of an existing renderbuffer object.");
    (**(code **)(lVar6 + 0xfa8))(this->m_rbo_valid,0x8058,0xffffffff,1);
    bVar2 = ExpectError(this,0x501,"NamedRenderbufferStorage","either of width is negative.");
    (**(code **)(lVar6 + 0xfa8))(this->m_rbo_valid,0x8058,1,0xffffffff);
    bVar3 = ExpectError(this,0x501,"NamedRenderbufferStorage","either of height is negative.");
    (**(code **)(lVar6 + 0xfa8))(this->m_rbo_valid,this->m_internalformat_invalid,1,1);
    bVar4 = ExpectError(this,0x500,"NamedRenderbufferStorage",
                        "internalformat is not a color-renderable, depth-renderable, or stencil-renderable format (it is COMPRESSED_RED)."
                       );
    Clean(this);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (((bVar1 && bVar2) && bVar3) && bVar4) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StorageErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		/* Prepare objects. */
		PrepareObjects();

		/*  Check that INVALID_OPERATION is generated by NamedRenderbufferStorage if
		 renderbuffer is not the name of an existing renderbuffer object. */
		gl.namedRenderbufferStorage(m_rbo_invalid, GL_RGBA8, 1, 1);

		is_ok &= ExpectError(GL_INVALID_OPERATION, "NamedRenderbufferStorage",
							 "renderbuffer is not the name of an existing renderbuffer object.");

		/*  Check that INVALID_VALUE is generated by NamedRenderbufferStorage if
		 either of width or height is negative, or greater than the value of
		 MAX_RENDERBUFFER_SIZE. */
		gl.namedRenderbufferStorage(m_rbo_valid, GL_RGBA8, -1, 1);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedRenderbufferStorage", "either of width is negative.");

		gl.namedRenderbufferStorage(m_rbo_valid, GL_RGBA8, 1, -1);

		is_ok &= ExpectError(GL_INVALID_VALUE, "NamedRenderbufferStorage", "either of height is negative.");

		/*  Check that INVALID_ENUM is generated by NamedRenderbufferStorage if
		 internalformat is not a color-renderable, depth-renderable, or
		 stencil-renderable format. */
		gl.namedRenderbufferStorage(m_rbo_valid, m_internalformat_invalid, 1, 1);

		is_ok &= ExpectError(GL_INVALID_ENUM, "NamedRenderbufferStorage", "internalformat is not a color-renderable, "
																		  "depth-renderable, or stencil-renderable "
																		  "format (it is COMPRESSED_RED).");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}